

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_capabilities.cpp
# Opt level: O3

void __thiscall
pfederc::Parser::parseCapabilityDirective
          (Parser *this,bool *isunused,bool *isinline,bool *isconstant)

{
  Token *pTVar1;
  size_t sVar2;
  size_t sVar3;
  bool bVar4;
  int iVar5;
  pointer *__ptr;
  string str;
  Error<pfederc::SyntaxErrorCode> *local_68;
  Error<pfederc::SyntaxErrorCode> *local_60 [2];
  long local_50;
  undefined1 local_40 [16];
  
  sanityExpect(this,TOK_DIRECTIVE);
  pTVar1 = this->lexer->currentToken;
  bVar4 = expect(this,TOK_ID);
  if (bVar4) {
    (*pTVar1->_vptr_Token[2])(local_60,pTVar1,this->lexer);
    iVar5 = std::__cxx11::string::compare((char *)local_60);
    if ((iVar5 == 0) && (*isunused == false)) {
      *isunused = true;
    }
    else {
      iVar5 = std::__cxx11::string::compare((char *)local_60);
      if ((iVar5 == 0) && (*isinline == false)) {
        *isinline = true;
      }
      else {
        iVar5 = std::__cxx11::string::compare((char *)local_60);
        if ((iVar5 == 0) && (*isconstant == false)) {
          *isconstant = true;
        }
        else {
          pTVar1 = this->lexer->currentToken;
          local_68 = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
          sVar2 = (pTVar1->pos).endIndex;
          local_68->logLevel = LVL_ERROR;
          local_68->err = STX_ERR_INVALID_CAPS_DIRECTIVE;
          sVar3 = (pTVar1->pos).startIndex;
          (local_68->pos).line = (pTVar1->pos).line;
          (local_68->pos).startIndex = sVar3;
          (local_68->pos).endIndex = sVar2;
          (local_68->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          (local_68->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          (local_68->extraPos).
          super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          generateError((Parser *)local_40,
                        (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                         *)this);
          std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
                    ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
                     local_40);
          if (local_68 != (Error<pfederc::SyntaxErrorCode> *)0x0) {
            std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                      ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)&local_68,
                       local_68);
          }
        }
      }
    }
    if (local_60[0] != (Error<pfederc::SyntaxErrorCode> *)&local_50) {
      operator_delete(local_60[0],local_50 + 1);
    }
  }
  else {
    pTVar1 = this->lexer->currentToken;
    local_60[0] = (Error<pfederc::SyntaxErrorCode> *)operator_new(0x38);
    sVar2 = (pTVar1->pos).endIndex;
    local_60[0]->logLevel = LVL_ERROR;
    local_60[0]->err = STX_ERR_INVALID_CAPS_DIRECTIVE;
    sVar3 = (pTVar1->pos).startIndex;
    (local_60[0]->pos).line = (pTVar1->pos).line;
    (local_60[0]->pos).startIndex = sVar3;
    (local_60[0]->pos).endIndex = sVar2;
    (local_60[0]->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (local_60[0]->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (local_60[0]->extraPos).
    super__Vector_base<pfederc::Position,_std::allocator<pfederc::Position>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    generateError((Parser *)(local_40 + 8),
                  (unique_ptr<pfederc::Error<pfederc::SyntaxErrorCode>,_std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>_>
                   *)this);
    std::unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_>::~unique_ptr
              ((unique_ptr<pfederc::ErrorExpr,_std::default_delete<pfederc::ErrorExpr>_> *)
               (local_40 + 8));
    if (local_60[0] != (Error<pfederc::SyntaxErrorCode> *)0x0) {
      std::default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_>::operator()
                ((default_delete<pfederc::Error<pfederc::SyntaxErrorCode>_> *)local_60,local_60[0]);
    }
  }
  return;
}

Assistant:

void Parser::parseCapabilityDirective(bool &isunused, bool &isinline, bool &isconstant) noexcept {
  sanityExpect(TokenType::TOK_DIRECTIVE);

  const Token *const tokId = lexer.getCurrentToken();
  if (!expect(TokenType::TOK_ID)) {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_CAPS_DIRECTIVE,
          lexer.getCurrentToken()->getPosition()));
    return;
  }

  std::string str = tokId->toString(getLexer());
  if (str == "Unused" && !isunused) {
    isunused = true;
  } else if (str == "Inline" && !isinline) {
    isinline = true;
  } else if (str == "Constant" && !isconstant) {
    isconstant = true;
  } else {
    generateError(std::make_unique<SyntaxError>(LVL_ERROR,
          SyntaxErrorCode::STX_ERR_INVALID_CAPS_DIRECTIVE,
          lexer.getCurrentToken()->getPosition()));
  }
}